

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O0

int run_test_tcp_bind_error_inval(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_108 [4];
  int r;
  uv_tcp_t server;
  sockaddr_in addr2;
  sockaddr_in addr1;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)addr2.sin_zero);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0xc1,"uv_ip4_addr(\"0.0.0.0\", 9123, &addr1)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,(sockaddr_in *)&server.queued_fds);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0xc2,"uv_ip4_addr(\"0.0.0.0\", 9124, &addr2)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)local_108);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0xc5,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_bind((uv_tcp_t *)local_108,(sockaddr *)addr2.sin_zero,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,199,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_bind((uv_tcp_t *)local_108,(sockaddr *)&server.queued_fds,0);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0xc9,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
    abort();
  }
  uv_close((uv_handle_t *)local_108,close_cb);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0xcf,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
            ,0xd1,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_bind_error_inval) {
  struct sockaddr_in addr1;
  struct sockaddr_in addr2;
  uv_tcp_t server;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr1));
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT_2, &addr2));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr1, 0);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr2, 0);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}